

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

void __thiscall CppGenerator::createGroupVariableOrder(CppGenerator *this)

{
  undefined8 *puVar1;
  pointer pvVar2;
  pointer pvVar3;
  TreeDecomposition *pTVar4;
  size_t *psVar5;
  pointer ppAVar6;
  Aggregate *pAVar7;
  long lVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  pointer puVar10;
  pointer puVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  ulong uVar16;
  ulong *puVar17;
  long lVar18;
  size_t sVar19;
  View *pVVar20;
  TDNode *pTVar21;
  TDNode *pTVar22;
  View *pVVar23;
  size_t sVar24;
  bool *__s;
  size_t *psVar25;
  size_t var_2;
  size_t i;
  CppGenerator *pCVar26;
  size_t var;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  bool bVar31;
  reference rVar32;
  bitset<100UL> bVar33;
  _Base_bitset<2UL> local_d0;
  CppGenerator *local_c0;
  var_bitset joinVars;
  vector<bool,_std::allocator<bool>_> incViewBitset;
  
  computeViewOrdering(this);
  pvVar2 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar15 = ((long)pvVar3 - (long)pvVar2) / 0x18;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar15;
  uVar16 = SUB168(auVar12 * ZEXT816(0x18),0);
  uVar29 = uVar16 + 8;
  if (0xfffffffffffffff7 < uVar16) {
    uVar29 = 0xffffffffffffffff;
  }
  if (SUB168(auVar12 * ZEXT816(0x18),8) != 0) {
    uVar29 = 0xffffffffffffffff;
  }
  local_c0 = this;
  puVar17 = (ulong *)operator_new__(uVar29);
  *puVar17 = uVar15;
  if (pvVar3 != pvVar2) {
    lVar18 = 0;
    do {
      *(undefined8 *)((long)puVar17 + lVar18 + 0x18) = 0;
      puVar1 = (undefined8 *)
               ((long)&(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar17 + 1))->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar18);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar18 = lVar18 + 0x18;
    } while ((long)pvVar3 - (long)pvVar2 != lVar18);
  }
  local_c0->groupVariableOrder =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar17 + 1);
  puVar17 = (ulong *)operator_new__(uVar29);
  *puVar17 = uVar15;
  if (pvVar3 != pvVar2) {
    lVar18 = 0;
    do {
      *(undefined8 *)((long)puVar17 + lVar18 + 0x18) = 0;
      puVar1 = (undefined8 *)
               ((long)&(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar17 + 1))->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar18);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar18 = lVar18 + 0x18;
    } while ((long)pvVar3 - (long)pvVar2 != lVar18);
  }
  local_c0->groupIncomingViews =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar17 + 1);
  puVar17 = (ulong *)operator_new__(uVar29);
  *puVar17 = uVar15;
  if ((long)pvVar3 - (long)pvVar2 != 0) {
    uVar29 = ((long)pvVar3 - (long)pvVar2) - 0x18;
    memset((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar17 + 1),0,
           (uVar29 - uVar29 % 0x18) + 0x18);
  }
  pCVar26 = local_c0;
  local_c0->groupViewsPerVarInfo =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar17 + 1);
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::resize
            (&local_c0->groupVariableOrderBitset,uVar15);
  for (uVar29 = 0;
      uVar29 < (ulong)(((long)(pCVar26->viewGroups).
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pCVar26->viewGroups).
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar29 = uVar29 + 1
      ) {
    joinVars.super__Base_bitset<2UL>._M_w = (_Base_bitset<2UL>)ZEXT816(0);
    sVar19 = QueryCompiler::numberOfViews
                       ((pCVar26->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&incViewBitset,sVar19,(allocator_type *)&local_d0);
    pTVar4 = (pCVar26->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    pVVar20 = QueryCompiler::getView
                        ((pCVar26->_qc).
                         super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         *(pCVar26->viewGroups).
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar29].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pTVar21 = TreeDecomposition::getRelation(pTVar4,(ulong)pVVar20->_origin);
    pTVar4 = (pCVar26->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    pVVar20 = QueryCompiler::getView
                        ((pCVar26->_qc).
                         super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         *(pCVar26->viewGroups).
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar29].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pTVar22 = TreeDecomposition::getRelation(pTVar4,(ulong)pVVar20->_destination);
    if (pTVar21->_id != pTVar22->_id) {
      local_d0._M_w = (_WordT  [2])std::operator&(&pTVar22->_bag,&pTVar21->_bag);
      std::_Base_bitset<2UL>::_M_do_or(&joinVars.super__Base_bitset<2UL>,&local_d0);
    }
    pvVar2 = (local_c0->viewGroups).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = *(pointer *)
              ((long)&pvVar2[uVar29].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (psVar25 = pvVar2[uVar29].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start; pCVar26 = local_c0, psVar25 != psVar5;
        psVar25 = psVar25 + 1) {
      pVVar20 = QueryCompiler::getView
                          ((local_c0->_qc).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           *psVar25);
      pTVar22 = TreeDecomposition::getRelation
                          ((pCVar26->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (ulong)pVVar20->_destination);
      lVar18 = pTVar21->_numOfNeighbors - (ulong)(pVVar20->_origin != pVVar20->_destination);
      if (lVar18 == 0) {
        local_d0._M_w = (_WordT  [2])std::operator&(&pVVar20->_fVars,&pTVar22->_bag);
        std::_Base_bitset<2UL>::_M_do_or(&joinVars.super__Base_bitset<2UL>,&local_d0);
      }
      else {
        for (uVar15 = 0;
            ppAVar6 = (pVVar20->_aggregates).
                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
            uVar15 < (ulong)((long)(pVVar20->_aggregates).
                                   super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar6 >> 3);
            uVar15 = uVar15 + 1) {
          pAVar7 = ppAVar6[uVar15];
          lVar28 = 0;
          for (uVar16 = 0; lVar27 = lVar28, lVar30 = lVar18,
              uVar16 < (ulong)(((long)*(pointer *)
                                       ((long)&(pAVar7->_agg).
                                               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                               ._M_impl + 8) -
                               *(long *)&(pAVar7->_agg).
                                         super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                         ._M_impl) / 0xc0); uVar16 = uVar16 + 1) {
            while (bVar31 = lVar30 != 0, lVar30 = lVar30 + -1, bVar31) {
              lVar8 = *(long *)&(pAVar7->_incoming).
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data;
              pVVar23 = QueryCompiler::getView
                                  ((local_c0->_qc).
                                   super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr,*(size_t *)(lVar8 + lVar27));
              local_d0._M_w = (_WordT  [2])std::operator&(&pVVar23->_fVars,&pTVar21->_bag);
              std::_Base_bitset<2UL>::_M_do_or(&joinVars.super__Base_bitset<2UL>,&local_d0);
              rVar32 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&incViewBitset,*(size_type *)(lVar8 + lVar27));
              *rVar32._M_p = *rVar32._M_p | rVar32._M_mask;
              lVar27 = lVar27 + 0x10;
            }
            lVar28 = lVar28 + lVar18 * 0x10;
          }
        }
      }
    }
    for (uVar15 = 0; local_d0._M_w[0] = uVar15, uVar15 < 100; uVar15 = uVar15 + 1) {
      if ((joinVars.super__Base_bitset<2UL>._M_w[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (pCVar26->groupVariableOrder + uVar29,local_d0._M_w);
        uVar15 = local_d0._M_w[0];
      }
    }
    if ((long)(pCVar26->viewGroups).
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pCVar26->viewGroups).
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x18) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_d0._M_w[1];
      local_d0._M_w = (_WordT  [2])(auVar14 << 0x40);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (pCVar26->groupVariableOrder + uVar29,local_d0._M_w);
    }
    std::_Base_bitset<2UL>::_M_do_or
              (&(pCVar26->groupVariableOrderBitset).
                super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl
                .super__Vector_impl_data._M_start[uVar29].super__Base_bitset<2UL>,
               &joinVars.super__Base_bitset<2UL>);
    pvVar9 = pCVar26->groupViewsPerVarInfo;
    puVar10 = pCVar26->groupVariableOrder[uVar29].
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar11 = pCVar26->groupVariableOrder[uVar29].
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    sVar19 = QueryCompiler::numberOfViews
                       ((pCVar26->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_d0._M_w[1];
    local_d0._M_w = (_WordT  [2])(auVar13 << 0x40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (pvVar9 + uVar29,(sVar19 + 2) * ((long)puVar11 - (long)puVar10 >> 3),local_d0._M_w);
    pCVar26 = local_c0;
    for (uVar15 = 0;
        puVar10 = pCVar26->groupVariableOrder[uVar29].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar15 < (ulong)((long)pCVar26->groupVariableOrder[uVar29].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 3);
        uVar15 = uVar15 + 1) {
      uVar16 = puVar10[uVar15];
      if (((pTVar21->_bag).super__Base_bitset<2UL>._M_w[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0) {
        sVar19 = QueryCompiler::numberOfViews
                           ((pCVar26->_qc).
                            super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        puVar10 = pCVar26->groupViewsPerVarInfo[uVar29].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar24 = QueryCompiler::numberOfViews
                           ((pCVar26->_qc).
                            super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        lVar18 = (sVar19 + 2) * uVar15;
        pCVar26->groupViewsPerVarInfo[uVar29].
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar18 + 1] = sVar24;
        puVar10 = puVar10 + lVar18;
        *puVar10 = *puVar10 + 1;
      }
    }
    uVar15 = 0;
    while( true ) {
      local_d0._M_w[0] = uVar15;
      sVar19 = QueryCompiler::numberOfViews
                         ((pCVar26->_qc).
                          super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (sVar19 <= uVar15) break;
      rVar32 = std::vector<bool,_std::allocator<bool>_>::operator[](&incViewBitset,local_d0._M_w[0])
      ;
      if ((*rVar32._M_p & rVar32._M_mask) != 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (pCVar26->groupIncomingViews + uVar29,local_d0._M_w);
        pVVar20 = QueryCompiler::getView
                            ((pCVar26->_qc).
                             super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             local_d0._M_w[0]);
        for (uVar15 = 0;
            puVar10 = pCVar26->groupVariableOrder[uVar29].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
            uVar15 < (ulong)((long)pCVar26->groupVariableOrder[uVar29].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 3);
            uVar15 = uVar15 + 1) {
          uVar16 = puVar10[uVar15];
          if (((pVVar20->_fVars).super__Base_bitset<2UL>._M_w[uVar16 >> 6] >> (uVar16 & 0x3f) & 1)
              != 0) {
            sVar19 = QueryCompiler::numberOfViews
                               ((pCVar26->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
            puVar10 = pCVar26->groupViewsPerVarInfo[uVar29].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start + (sVar19 + 2) * uVar15;
            puVar10[*puVar10 + 1] = local_d0._M_w[0];
            *puVar10 = *puVar10 + 1;
          }
        }
      }
      uVar15 = local_d0._M_w[0] + 1;
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&incViewBitset.super__Bvector_base<std::allocator<bool>_>);
  }
  sVar19 = QueryCompiler::numberOfViews
                     ((pCVar26->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  __s = (bool *)operator_new__(sVar19);
  uVar29 = 0;
  memset(__s,0,sVar19);
  pCVar26->_requireHashing = __s;
  do {
    sVar19 = QueryCompiler::numberOfViews
                       ((pCVar26->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    if (sVar19 <= uVar29) {
      return;
    }
    pVVar20 = QueryCompiler::getView
                        ((pCVar26->_qc).
                         super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,uVar29
                        );
    pTVar21 = TreeDecomposition::getRelation
                        ((pCVar26->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ulong)pVVar20->_origin);
    incViewBitset.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base =
         (_Bit_iterator_base)std::operator&(&pVVar20->_fVars,&pTVar21->_bag);
    lVar18 = 0;
    for (uVar15 = 0; uVar15 != 100; uVar15 = uVar15 + 1) {
      if ((*(ulong *)((long)&incViewBitset.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     (uVar15 >> 6) * 8) >> (uVar15 & 0x3f) & 1) != 0) {
        if (uVar15 != pCVar26->sortOrders[pVVar20->_origin][lVar18]) {
          bVar31 = true;
          goto LAB_001948c9;
        }
        lVar18 = lVar18 + 1;
      }
    }
    joinVars.super__Base_bitset<2UL>._M_w =
         (_Base_bitset<2UL>)std::bitset<100UL>::operator~((bitset<100UL> *)&incViewBitset);
    bVar33 = std::operator&(&pVVar20->_fVars,&joinVars);
    bVar31 = bVar33.super__Base_bitset<2UL>._M_w[1] != 0 ||
             bVar33.super__Base_bitset<2UL>._M_w[0] != 0;
LAB_001948c9:
    local_c0->_requireHashing[uVar29] = bVar31;
    uVar29 = uVar29 + 1;
    pCVar26 = local_c0;
  } while( true );
}

Assistant:

void CppGenerator::createGroupVariableOrder()
{
    computeViewOrdering();
    
    groupVariableOrder = new std::vector<size_t>[viewGroups.size()]();
    groupIncomingViews = new std::vector<size_t>[viewGroups.size()]();
    groupViewsPerVarInfo = new std::vector<size_t>[viewGroups.size()];

    groupVariableOrderBitset.resize(viewGroups.size());
    
    for (size_t group = 0; group < viewGroups.size(); ++group)
    {
        var_bitset joinVars;
        std::vector<bool> incViewBitset(_qc->numberOfViews());
        
        TDNode* baseRelation = _td->getRelation(
            _qc->getView(viewGroups[group][0])->_origin);

        // TODO:TODO: is it ok to add this in ?!??
        // we are adding the variables in the intersection with the destination
        TDNode* destRelation = _td->getRelation(
            _qc->getView(viewGroups[group][0])->_destination);

        if (baseRelation->_id != destRelation->_id)
            joinVars |= destRelation->_bag & baseRelation->_bag;

        for (const size_t& viewID : viewGroups[group])
        {
            View* view = _qc->getView(viewID);

            TDNode* destRelation = _td->getRelation(view->_destination);

            size_t numberIncomingViews =
                (view->_origin == view->_destination ? baseRelation->_numOfNeighbors :
                 baseRelation->_numOfNeighbors - 1);

            // if ther are not inc views we use the fVars as free variable
            if (numberIncomingViews == 0)
                joinVars |= (view->_fVars & destRelation->_bag);
            else
            {
                for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
                {
                    Aggregate* aggregate = view->_aggregates[aggNo];

                    size_t incOffset = 0;
                    // First find the all views that contribute to this Aggregate
                    for (size_t i = 0; i < aggregate->_agg.size(); ++i)
                    {
                        for (size_t j = 0; j < numberIncomingViews; j++)
                        {
                            const size_t& incViewID =
                                aggregate->_incoming[incOffset].first;


                            // TODO: TODO: TODO: MAKE SURE THAT YOU ALSO
                            // CONSIDER INTERSECTION OF FREE VARS THAT ARE
                            // SHARED B/W TWO VIEWS BUT NOT IN BAG
                            
                            // Add the intersection of the view and the base
                            // relation to joinVars
                            joinVars |= (_qc->getView(incViewID)->_fVars &
                                         baseRelation->_bag);
                            // Indicate that this view contributes to some aggregate
                            incViewBitset[incViewID] = 1;
                            ++incOffset;
                        }                        
                    }
                }
            }
        }

        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
            if (joinVars[var])
                groupVariableOrder[group].push_back(var);

        if(viewGroups.size() == 1) {
            DINFO("There is only a single relation! \n"); 
            assert(groupVariableOrder[group].size() == 0);
            assert(destRelation->_bag[0]);
            groupVariableOrder[group].push_back(0);
        }


        groupVariableOrderBitset[group] |= joinVars;
        
        groupViewsPerVarInfo[group].resize(groupVariableOrder[group].size() *
                                       (_qc->numberOfViews() + 2), 0);

        // For each variable, check if the baseRelation contains this variable
        for (size_t var=0; var < groupVariableOrder[group].size(); ++var)
        {
            if (baseRelation->_bag[groupVariableOrder[group][var]])
            {
                size_t idx = var * (_qc->numberOfViews() + 2);
                size_t& off = groupViewsPerVarInfo[group][idx];
                groupViewsPerVarInfo[group][idx+1] = _qc->numberOfViews();
                ++off;
            }
        }

        // For each incoming view, check if it contains any vars from the
        // variable order and then add it to the corresponding info
        for (size_t incViewID=0; incViewID < _qc->numberOfViews(); ++incViewID)
        {
            if (incViewBitset[incViewID])
            {
                groupIncomingViews[group].push_back(incViewID);
                const var_bitset& viewFVars = _qc->getView(incViewID)->_fVars;
                    
                for (size_t var=0; var < groupVariableOrder[group].size(); ++var)
                {
                    if (viewFVars[groupVariableOrder[group][var]])
                    {
                        size_t idx = var * (_qc->numberOfViews() + 2);
                        size_t& off = groupViewsPerVarInfo[group][idx];
                        groupViewsPerVarInfo[group][idx+off+1] = incViewID;
                        ++off;
                    }
                }
            }
        }      
    }

    _requireHashing = new bool[_qc->numberOfViews()]();

    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);
        bool hash = false;
        size_t orderIdx = 0;
        
        var_bitset intersection = view->_fVars & _td->getRelation(view->_origin)->_bag;
        
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (intersection[var])
            {
                if (sortOrders[view->_origin][orderIdx] != var)
                {
                    hash = true;
                    break;
                }
                ++orderIdx;
            }
        }
        _requireHashing[viewID] = hash || (view->_fVars & ~intersection).any();
    }
}